

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O0

void __thiscall chrono::curiosity::Curiosity::Update(Curiosity *this)

{
  int iVar1;
  element_type *peVar2;
  reference pvVar3;
  __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar4;
  reference pvVar5;
  __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var6;
  element_type *peVar7;
  value_type_conflict local_48;
  double steering_1;
  value_type_conflict vStack_38;
  int i_2;
  double steering;
  value_type_conflict vStack_28;
  int i_1;
  double driving;
  double dStack_18;
  int i;
  double time;
  Curiosity *this_local;
  
  time = (double)this;
  dStack_18 = ChSystem::GetChTime(this->m_system);
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_driver);
  (*peVar2->_vptr_CuriosityDriver[3])(dStack_18);
  peVar2 = std::
           __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_driver);
  iVar1 = (*peVar2->_vptr_CuriosityDriver[2])();
  if (iVar1 == 0) {
    for (driving._4_4_ = 0; driving._4_4_ < 6; driving._4_4_ = driving._4_4_ + 1) {
      peVar2 = std::
               __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&this->m_driver);
      pvVar3 = std::array<double,_6UL>::operator[](&peVar2->drive_speeds,(long)driving._4_4_);
      vStack_28 = *pvVar3;
      this_00 = (__shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_6UL>::operator[]
                             (&this->m_drive_motor_funcs,(long)driving._4_4_);
      peVar4 = std::
               __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      (**(code **)(*(long *)peVar4 + 0xd0))(vStack_28,dStack_18);
    }
  }
  for (steering._4_4_ = 0; steering._4_4_ < 2; steering._4_4_ = steering._4_4_ + 1) {
    peVar2 = std::
             __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    pvVar5 = std::array<double,_4UL>::operator[](&peVar2->steer_angles,(long)steering._4_4_);
    vStack_38 = *pvVar5;
    ChClampValue<double>(&stack0xffffffffffffffc8,-1.4835298641951802,1.4835298641951802);
    p_Var6 = (__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_rocker_motor_funcs,(long)steering._4_4_);
    peVar7 = std::
             __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    ChFunction_Const::Set_yconst(peVar7,vStack_38);
  }
  for (steering_1._4_4_ = 0; steering_1._4_4_ < 2; steering_1._4_4_ = steering_1._4_4_ + 1) {
    peVar2 = std::
             __shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::curiosity::CuriosityDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    pvVar5 = std::array<double,_4UL>::operator[](&peVar2->steer_angles,(long)(steering_1._4_4_ + 2))
    ;
    local_48 = *pvVar5;
    ChClampValue<double>(&local_48,-1.4835298641951802,1.4835298641951802);
    p_Var6 = (__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::ChFunction_Const>,_2UL>::operator[]
                          (&this->m_bogie_motor_funcs,(long)steering_1._4_4_);
    peVar7 = std::
             __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var6);
    ChFunction_Const::Set_yconst(peVar7,local_48);
  }
  return;
}

Assistant:

void Curiosity::Update() {
    double time = m_system->GetChTime();
    m_driver->Update(time);

    if (m_driver->GetDriveMotorType() == CuriosityDriver::DriveMotorType::SPEED) {
        for (int i = 0; i < 6; i++) {
            double driving = m_driver->drive_speeds[i];
            m_drive_motor_funcs[i]->SetSetpoint(driving, time);
        }
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_rocker_motor_funcs[i]->Set_yconst(steering);
    }

    for (int i = 0; i < 2; i++) {
        double steering = m_driver->steer_angles[i + 2];
        // Enforce maximum steering angle
        ChClampValue(steering, -max_steer_angle, +max_steer_angle);
        m_bogie_motor_funcs[i]->Set_yconst(steering);
    }
}